

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

bool __thiscall sf::Texture::loadFromImage(Texture *this,Image *image,IntRect *area)

{
  uint uVar1;
  uint width;
  bool bVar2;
  uint uVar3;
  Vector2u VVar4;
  Vector2u VVar5;
  Uint8 *pUVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  TransientContextLock lock;
  TextureSaver save;
  
  VVar4 = Image::getSize(image);
  VVar5 = Image::getSize(image);
  uVar1 = area->width;
  if ((uVar1 == 0) || (uVar9 = area->height, uVar9 == 0)) {
LAB_00134d94:
    VVar4 = Image::getSize(image);
    VVar5 = Image::getSize(image);
    bVar2 = create(this,VVar4.x,VVar5.y);
    if (!bVar2) {
      iVar7 = 0;
      goto LAB_00134dd1;
    }
    update(this,image);
  }
  else {
    iVar10 = area->left;
    iVar8 = area->top;
    uVar11 = VVar4.x;
    uVar3 = VVar5.y;
    if (((int)uVar3 <= (int)uVar9 && (int)uVar11 <= (int)uVar1) && (iVar8 < 1 && iVar10 < 1))
    goto LAB_00134d94;
    iVar7 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    if (iVar8 < 1) {
      iVar8 = iVar7;
    }
    width = uVar11 - iVar10;
    if ((int)(iVar10 + uVar1) <= (int)uVar11) {
      width = uVar1;
    }
    uVar1 = uVar3 - iVar8;
    if ((int)(uVar9 + iVar8) <= (int)uVar3) {
      uVar1 = uVar9;
    }
    bVar2 = create(this,width,uVar1);
    if (!bVar2) goto LAB_00134dd1;
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::TextureSaver::TextureSaver(&save);
    pUVar6 = Image::getPixelsPtr(image);
    glBindTexture(0xde1,this->m_texture);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x121,"glBindTexture(GL_TEXTURE_2D, m_texture)");
    pUVar6 = pUVar6 + (int)((iVar8 * uVar11 + iVar10) * 4);
    uVar9 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = uVar9;
    }
    for (; uVar1 != uVar9; uVar9 = uVar9 + 1) {
      glTexSubImage2D(0xde1,0,0,uVar9,width,1,0x1908,0x1401,pUVar6);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x124,
                         "glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels)"
                        );
      pUVar6 = pUVar6 + (int)(uVar11 << 2);
    }
    glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x128,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                      );
    this->m_hasMipmap = false;
    glFlush();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x12d,"glFlush()");
    priv::TextureSaver::~TextureSaver(&save);
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  iVar7 = 1;
LAB_00134dd1:
  return SUB41(iVar7,0);
}

Assistant:

bool Texture::loadFromImage(const Image& image, const IntRect& area)
{
    // Retrieve the image size
    int width = static_cast<int>(image.getSize().x);
    int height = static_cast<int>(image.getSize().y);

    // Load the entire image if the source area is either empty or contains the whole image
    if (area.width == 0 || (area.height == 0) ||
       ((area.left <= 0) && (area.top <= 0) && (area.width >= width) && (area.height >= height)))
    {
        // Load the entire image
        if (create(image.getSize().x, image.getSize().y))
        {
            update(image);

            return true;
        }
        else
        {
            return false;
        }
    }
    else
    {
        // Load a sub-area of the image

        // Adjust the rectangle to the size of the image
        IntRect rectangle = area;
        if (rectangle.left   < 0) rectangle.left = 0;
        if (rectangle.top    < 0) rectangle.top  = 0;
        if (rectangle.left + rectangle.width > width)  rectangle.width  = width - rectangle.left;
        if (rectangle.top + rectangle.height > height) rectangle.height = height - rectangle.top;

        // Create the texture and upload the pixels
        if (create(rectangle.width, rectangle.height))
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            // Copy the pixels to the texture, row by row
            const Uint8* pixels = image.getPixelsPtr() + 4 * (rectangle.left + (width * rectangle.top));
            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            for (int i = 0; i < rectangle.height; ++i)
            {
                glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
                pixels += 4 * width;
            }

            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            m_hasMipmap = false;

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());

            return true;
        }
        else
        {
            return false;
        }
    }
}